

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

Value * __thiscall
ot::commissioner::Interpreter::ProcessState
          (Value *__return_storage_ptr__,Interpreter *this,Expression *param_1)

{
  bool bVar1;
  int iVar2;
  element_type *this_00;
  Value *this_01;
  element_type *peVar3;
  allocator local_271;
  string local_270;
  Value local_250;
  allocator local_201;
  string local_200;
  Value local_1e0;
  allocator local_191;
  string local_190;
  Value local_170;
  allocator local_121;
  string local_120;
  Value local_100;
  ErrorCode local_b8 [4];
  Error local_a8;
  Value local_80;
  undefined1 local_38 [8];
  CommissionerAppPtr commissioner;
  Expression *param_1_local;
  Interpreter *this_local;
  Value *value;
  
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 0;
  Value::Value(__return_storage_ptr__);
  std::shared_ptr<ot::commissioner::CommissionerApp>::shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_38,(nullptr_t)0x0);
  this_00 = std::
            __shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->mJobManager);
  JobManager::GetSelectedCommissioner(&local_a8,this_00,(CommissionerAppPtr *)local_38);
  Value::Value(&local_80,&local_a8);
  this_01 = Value::operator=(__return_storage_ptr__,&local_80);
  local_b8[0] = kNone;
  bVar1 = Value::operator!=(this_01,local_b8);
  Value::~Value(&local_80);
  Error::~Error(&local_a8);
  if (!bVar1) {
    peVar3 = std::
             __shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    iVar2 = (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0xb])();
    switch((char)iVar2) {
    case '\0':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_120,"disabled",&local_121);
      Value::Value(&local_100,&local_120);
      Value::operator=(__return_storage_ptr__,&local_100);
      Value::~Value(&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::allocator<char>::~allocator((allocator<char> *)&local_121);
      break;
    case '\x01':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_190,"connected",&local_191);
      Value::Value(&local_170,&local_190);
      Value::operator=(__return_storage_ptr__,&local_170);
      Value::~Value(&local_170);
      std::__cxx11::string::~string((string *)&local_190);
      std::allocator<char>::~allocator((allocator<char> *)&local_191);
      break;
    case '\x02':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_200,"petitioning",&local_201);
      Value::Value(&local_1e0,&local_200);
      Value::operator=(__return_storage_ptr__,&local_1e0);
      Value::~Value(&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
      break;
    case '\x03':
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_270,"active",&local_271);
      Value::Value(&local_250,&local_270);
      Value::operator=(__return_storage_ptr__,&local_250);
      Value::~Value(&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
    }
  }
  commissioner.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._7_1_ = 1;
  std::shared_ptr<ot::commissioner::CommissionerApp>::~shared_ptr
            ((shared_ptr<ot::commissioner::CommissionerApp> *)local_38);
  if ((commissioner.
       super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
       ._M_pi._7_1_ & 1) == 0) {
    Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessState(const Expression &)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));

    switch (commissioner->GetState())
    {
    case State::kDisabled:
        value = std::string("disabled");
        break;
    case State::kConnected:
        value = std::string("connected");
        break;
    case State::kPetitioning:
        value = std::string("petitioning");
        break;
    case State::kActive:
        value = std::string("active");
        break;
    }

exit:
    return value;
}